

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O2

int ecp_mod_koblitz(mbedtls_mpi *N,mbedtls_mpi_uint *Rp,size_t p_limbs,size_t adjust,size_t shift,
                   mbedtls_mpi_uint mask)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  mbedtls_mpi local_b0;
  mbedtls_mpi_uint local_98;
  size_t local_90;
  long local_88;
  mbedtls_mpi R;
  mbedtls_mpi_uint Mp [6];
  
  iVar2 = 0;
  if (p_limbs <= N->n) {
    local_b0.s = 1;
    R.n = 1;
    local_b0.p = Mp;
    uVar3 = N->n - (p_limbs - adjust);
    uVar1 = adjust + p_limbs;
    if (uVar1 <= uVar3) {
      uVar3 = uVar1;
    }
    Mp[0] = 0;
    Mp[1] = 0;
    Mp[2] = 0;
    Mp[3] = 0;
    Mp[4] = 0;
    Mp[5] = 0;
    local_88 = p_limbs * 8;
    local_b0.n = uVar3;
    local_98 = mask;
    local_90 = shift;
    R.s = local_b0.s;
    R.p = Rp;
    memcpy(local_b0.p,N->p + (p_limbs - adjust),uVar3 * 8);
    if ((local_90 == 0) ||
       (iVar2 = mbedtls_mpi_shift_r(&local_b0,local_90), uVar3 = local_b0.n, iVar2 == 0)) {
      local_b0.n = uVar3 + 1;
      uVar3 = p_limbs;
      if (local_98 != 0) {
        N->p[p_limbs - 1] = N->p[p_limbs - 1] & local_98;
      }
      for (; uVar3 < N->n; uVar3 = uVar3 + 1) {
        N->p[uVar3] = 0;
      }
      iVar2 = mbedtls_mpi_mul_mpi(&local_b0,&local_b0,&R);
      if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_add_abs(N,N,&local_b0), iVar2 == 0)) {
        uVar3 = N->n - (p_limbs - adjust);
        if (uVar1 <= uVar3) {
          uVar3 = uVar1;
        }
        Mp[0] = 0;
        Mp[1] = 0;
        Mp[2] = 0;
        Mp[3] = 0;
        Mp[4] = 0;
        Mp[5] = 0;
        local_b0.n = uVar3;
        memcpy(Mp,(void *)((long)N->p + adjust * -8 + local_88),uVar3 * 8);
        if ((local_90 == 0) ||
           (iVar2 = mbedtls_mpi_shift_r(&local_b0,local_90), uVar3 = local_b0.n, iVar2 == 0)) {
          local_b0.n = uVar3 + R.n;
          if (local_98 != 0) {
            N->p[p_limbs - 1] = N->p[p_limbs - 1] & local_98;
          }
          for (; p_limbs < N->n; p_limbs = p_limbs + 1) {
            N->p[p_limbs] = 0;
          }
          iVar2 = mbedtls_mpi_mul_mpi(&local_b0,&local_b0,&R);
          if (iVar2 == 0) {
            iVar2 = mbedtls_mpi_add_abs(N,N,&local_b0);
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static inline int ecp_mod_koblitz( mbedtls_mpi *N, mbedtls_mpi_uint *Rp, size_t p_limbs,
                                   size_t adjust, size_t shift, mbedtls_mpi_uint mask )
{
    int ret;
    size_t i;
    mbedtls_mpi M, R;
    mbedtls_mpi_uint Mp[P_KOBLITZ_MAX + P_KOBLITZ_R + 1];

    if( N->n < p_limbs )
        return( 0 );

    /* Init R */
    R.s = 1;
    R.p = Rp;
    R.n = P_KOBLITZ_R;

    /* Common setup for M */
    M.s = 1;
    M.p = Mp;

    /* M = A1 */
    M.n = N->n - ( p_limbs - adjust );
    if( M.n > p_limbs + adjust )
        M.n = p_limbs + adjust;
    memset( Mp, 0, sizeof Mp );
    memcpy( Mp, N->p + p_limbs - adjust, M.n * sizeof( mbedtls_mpi_uint ) );
    if( shift != 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &M, shift ) );
    M.n += R.n; /* Make room for multiplication by R */

    /* N = A0 */
    if( mask != 0 )
        N->p[p_limbs - 1] &= mask;
    for( i = p_limbs; i < N->n; i++ )
        N->p[i] = 0;

    /* N = A0 + R * A1 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &M, &M, &R ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_abs( N, N, &M ) );

    /* Second pass */

    /* M = A1 */
    M.n = N->n - ( p_limbs - adjust );
    if( M.n > p_limbs + adjust )
        M.n = p_limbs + adjust;
    memset( Mp, 0, sizeof Mp );
    memcpy( Mp, N->p + p_limbs - adjust, M.n * sizeof( mbedtls_mpi_uint ) );
    if( shift != 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &M, shift ) );
    M.n += R.n; /* Make room for multiplication by R */

    /* N = A0 */
    if( mask != 0 )
        N->p[p_limbs - 1] &= mask;
    for( i = p_limbs; i < N->n; i++ )
        N->p[i] = 0;

    /* N = A0 + R * A1 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &M, &M, &R ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_abs( N, N, &M ) );

cleanup:
    return( ret );
}